

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CandidateVector *
spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::get_candidates_for_feature
          (CandidateVector *__return_storage_ptr__,Feature ft,Result *r)

{
  Candidate *__first;
  Candidate *__last;
  anon_class_8_1_54a39812 cmp;
  Result *r_local;
  Feature ft_local;
  CandidateVector *c;
  
  get_candidates_for_feature(__return_storage_ptr__,ft);
  __first = VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>::begin
                      (&__return_storage_ptr__->
                        super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                      );
  __last = VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>::end
                     (&__return_storage_ptr__->
                       super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                     );
  ::std::
  sort<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate*,spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::get_candidates_for_feature(spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Result_const&)::__0>
            (__first,__last,(anon_class_8_1_54a39812)r);
  return __return_storage_ptr__;
}

Assistant:

CompilerGLSL::ShaderSubgroupSupportHelper::CandidateVector CompilerGLSL::ShaderSubgroupSupportHelper::
    get_candidates_for_feature(Feature ft, const Result &r)
{
	auto c = get_candidates_for_feature(ft);
	auto cmp = [&r](Candidate a, Candidate b) {
		if (r.weights[a] == r.weights[b])
			return a < b; // Prefer candidates with lower enum value
		return r.weights[a] > r.weights[b];
	};
	std::sort(c.begin(), c.end(), cmp);
	return c;
}